

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.h
# Opt level: O3

Pointer __thiscall
snestistics::AnnotationResolver::find_last_free_after_or_at
          (AnnotationResolver *this,Pointer p,Pointer stop)

{
  int iVar1;
  uint uVar2;
  pointer pAVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  if (p <= stop) {
    uVar2 = (this->_annotation_for_adress)._size;
    pAVar3 = (this->_annotations).
             super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar4 = 0;
    do {
      uVar5 = p + iVar4;
      if (uVar5 < uVar2) {
        if ((ulong)(long)(int)uVar2 <= (ulong)uVar5) {
          __assert_fail("index<_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                        ,0x12a,
                        "const T &snestistics::Array<int>::operator[](const uint64_t) const [T = int]"
                       );
        }
        lVar6 = (long)(this->_annotation_for_adress)._data[uVar5];
        if ((lVar6 != -1) && (pAVar3[lVar6].type - ANNOTATION_FUNCTION < 2)) {
          if (iVar4 != 0) {
            return pAVar3[lVar6].startOfRange - 1;
          }
          return 0xffffffff;
        }
      }
      iVar1 = p + iVar4;
      iVar4 = iVar4 + 1;
    } while (iVar1 + 1U <= stop);
  }
  return stop;
}

Assistant:

Pointer find_last_free_after_or_at(Pointer p, Pointer stop) const {

		// Assume in same bank
		for (uint32_t i = p; i <= stop; i++) {
			if (i >= _annotation_for_adress.size())
				continue;
			int ai = _annotation_for_adress[i];
			if (ai == -1)
				continue;
			const Annotation &a = _annotations[ai];
			if (a.type == ANNOTATION_FUNCTION || a.type == ANNOTATION_DATA) {
				if (i==p)
					return INVALID_POINTER; // No valid
				return a.startOfRange-1; // Min here if we stared in a function
			}
		}
		return stop;
	}